

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O3

int nghttp2_session_add_ping(nghttp2_session *session,uint8_t flags,uint8_t *opaque_data)

{
  int iVar1;
  nghttp2_outbound_item *item;
  
  if (((flags & 1) == 0) ||
     (iVar1 = -0x388, session->obq_flood_counter_ < session->max_outbound_ack)) {
    item = (nghttp2_outbound_item *)nghttp2_mem_malloc(&session->mem,0x98);
    if (item == (nghttp2_outbound_item *)0x0) {
      iVar1 = -0x385;
    }
    else {
      nghttp2_outbound_item_init(item);
      nghttp2_frame_ping_init((nghttp2_ping *)item,flags,opaque_data);
      iVar1 = nghttp2_session_add_item(session,item);
      if (iVar1 == 0) {
        iVar1 = 0;
        if ((flags & 1) != 0) {
          session->obq_flood_counter_ = session->obq_flood_counter_ + 1;
        }
      }
      else {
        nghttp2_frame_ping_free((nghttp2_ping *)item);
        nghttp2_mem_free(&session->mem,item);
      }
    }
  }
  return iVar1;
}

Assistant:

int nghttp2_session_add_ping(nghttp2_session *session, uint8_t flags,
                             const uint8_t *opaque_data) {
  int rv;
  nghttp2_outbound_item *item;
  nghttp2_frame *frame;
  nghttp2_mem *mem;

  mem = &session->mem;

  if ((flags & NGHTTP2_FLAG_ACK) &&
      session->obq_flood_counter_ >= session->max_outbound_ack) {
    return NGHTTP2_ERR_FLOODED;
  }

  item = nghttp2_mem_malloc(mem, sizeof(nghttp2_outbound_item));
  if (item == NULL) {
    return NGHTTP2_ERR_NOMEM;
  }

  nghttp2_outbound_item_init(item);

  frame = &item->frame;

  nghttp2_frame_ping_init(&frame->ping, flags, opaque_data);

  rv = nghttp2_session_add_item(session, item);

  if (rv != 0) {
    nghttp2_frame_ping_free(&frame->ping);
    nghttp2_mem_free(mem, item);
    return rv;
  }

  if (flags & NGHTTP2_FLAG_ACK) {
    ++session->obq_flood_counter_;
  }

  return 0;
}